

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Futex.cpp
# Opt level: O0

timespec timeSpecFromTimePoint<std::chrono::_V2::system_clock>
                   (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    absTime)

{
  timespec tVar1;
  rep rVar2;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> nanos;
  __enable_if_is_duration<std::chrono::duration<long>_> secs;
  duration epoch;
  timespec result;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_ffffffffffffffa8;
  duration<long,_std::ratio<1L,_1L>_> *in_stack_ffffffffffffffc0;
  duration<long,_std::ratio<1L,_1000000000L>_> in_stack_ffffffffffffffc8;
  duration<long,_std::ratio<1L,_1L>_> local_30;
  rep local_28;
  duration<long,_std::ratio<1L,_1000000000L>_> local_20;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_18;
  rep local_10;
  
  local_20.__r = (rep)std::chrono::
                      time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      ::time_since_epoch(&local_18);
  rVar2 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_20);
  if (rVar2 < 0) {
    local_28 = (rep)std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::zero();
    local_20 = (duration<long,_std::ratio<1L,_1000000000L>_>)local_28;
  }
  local_30.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                                (in_stack_ffffffffffffffa8);
  std::chrono::operator-
            ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_ffffffffffffffc8.__r,
             in_stack_ffffffffffffffc0);
  std::chrono::
  duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
            (in_stack_ffffffffffffffa8);
  local_10 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_30);
  rVar2 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
                    ((duration<long,_std::ratio<1L,_1000000000L>_> *)&stack0xffffffffffffffc8);
  tVar1.tv_nsec = rVar2;
  tVar1.tv_sec = local_10;
  return tVar1;
}

Assistant:

struct timespec timeSpecFromTimePoint(time_point<Clock> absTime) {
    auto epoch = absTime.time_since_epoch();
    if (epoch.count() < 0) {
        // kernel timespec_valid requires non-negative seconds and nanos in [0,1G)
        epoch = Clock::duration::zero();
    }

    // timespec-safe seconds and nanoseconds;
    // chrono::{nano,}seconds are `long long int`
    // whereas timespec uses smaller types
    using time_t_seconds = duration<std::time_t, seconds::period>;
    using long_nanos = duration<long int, nanoseconds::period>;

    auto secs = duration_cast<time_t_seconds>(epoch);
    auto nanos = duration_cast<long_nanos>(epoch - secs);
    struct timespec result = {secs.count(), nanos.count()};
    return result;
}